

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void sf_glad_gl_load_GL_ARB_separate_shader_objects(GLADuserptrloadfunc load,void *userptr)

{
  undefined8 in_RSI;
  code *in_RDI;
  
  if (SF_GLAD_GL_ARB_separate_shader_objects != 0) {
    sf_glad_glActiveShaderProgram =
         (PFNGLACTIVESHADERPROGRAMPROC)(*in_RDI)(in_RSI,"glActiveShaderProgram");
    sf_glad_glBindProgramPipeline =
         (PFNGLBINDPROGRAMPIPELINEPROC)(*in_RDI)(in_RSI,"glBindProgramPipeline");
    sf_glad_glCreateShaderProgramv =
         (PFNGLCREATESHADERPROGRAMVPROC)(*in_RDI)(in_RSI,"glCreateShaderProgramv");
    sf_glad_glDeleteProgramPipelines =
         (PFNGLDELETEPROGRAMPIPELINESPROC)(*in_RDI)(in_RSI,"glDeleteProgramPipelines");
    sf_glad_glGenProgramPipelines =
         (PFNGLGENPROGRAMPIPELINESPROC)(*in_RDI)(in_RSI,"glGenProgramPipelines");
    sf_glad_glGetProgramPipelineInfoLog =
         (PFNGLGETPROGRAMPIPELINEINFOLOGPROC)(*in_RDI)(in_RSI,"glGetProgramPipelineInfoLog");
    sf_glad_glGetProgramPipelineiv =
         (PFNGLGETPROGRAMPIPELINEIVPROC)(*in_RDI)(in_RSI,"glGetProgramPipelineiv");
    sf_glad_glIsProgramPipeline =
         (PFNGLISPROGRAMPIPELINEPROC)(*in_RDI)(in_RSI,"glIsProgramPipeline");
    sf_glad_glProgramParameteri =
         (PFNGLPROGRAMPARAMETERIPROC)(*in_RDI)(in_RSI,"glProgramParameteri");
    sf_glad_glProgramUniform1d = (PFNGLPROGRAMUNIFORM1DPROC)(*in_RDI)(in_RSI,"glProgramUniform1d");
    sf_glad_glProgramUniform1dv =
         (PFNGLPROGRAMUNIFORM1DVPROC)(*in_RDI)(in_RSI,"glProgramUniform1dv");
    sf_glad_glProgramUniform1f = (PFNGLPROGRAMUNIFORM1FPROC)(*in_RDI)(in_RSI,"glProgramUniform1f");
    sf_glad_glProgramUniform1fv =
         (PFNGLPROGRAMUNIFORM1FVPROC)(*in_RDI)(in_RSI,"glProgramUniform1fv");
    sf_glad_glProgramUniform1i = (PFNGLPROGRAMUNIFORM1IPROC)(*in_RDI)(in_RSI,"glProgramUniform1i");
    sf_glad_glProgramUniform1iv =
         (PFNGLPROGRAMUNIFORM1IVPROC)(*in_RDI)(in_RSI,"glProgramUniform1iv");
    sf_glad_glProgramUniform1ui =
         (PFNGLPROGRAMUNIFORM1UIPROC)(*in_RDI)(in_RSI,"glProgramUniform1ui");
    sf_glad_glProgramUniform1uiv =
         (PFNGLPROGRAMUNIFORM1UIVPROC)(*in_RDI)(in_RSI,"glProgramUniform1uiv");
    sf_glad_glProgramUniform2d = (PFNGLPROGRAMUNIFORM2DPROC)(*in_RDI)(in_RSI,"glProgramUniform2d");
    sf_glad_glProgramUniform2dv =
         (PFNGLPROGRAMUNIFORM2DVPROC)(*in_RDI)(in_RSI,"glProgramUniform2dv");
    sf_glad_glProgramUniform2f = (PFNGLPROGRAMUNIFORM2FPROC)(*in_RDI)(in_RSI,"glProgramUniform2f");
    sf_glad_glProgramUniform2fv =
         (PFNGLPROGRAMUNIFORM2FVPROC)(*in_RDI)(in_RSI,"glProgramUniform2fv");
    sf_glad_glProgramUniform2i = (PFNGLPROGRAMUNIFORM2IPROC)(*in_RDI)(in_RSI,"glProgramUniform2i");
    sf_glad_glProgramUniform2iv =
         (PFNGLPROGRAMUNIFORM2IVPROC)(*in_RDI)(in_RSI,"glProgramUniform2iv");
    sf_glad_glProgramUniform2ui =
         (PFNGLPROGRAMUNIFORM2UIPROC)(*in_RDI)(in_RSI,"glProgramUniform2ui");
    sf_glad_glProgramUniform2uiv =
         (PFNGLPROGRAMUNIFORM2UIVPROC)(*in_RDI)(in_RSI,"glProgramUniform2uiv");
    sf_glad_glProgramUniform3d = (PFNGLPROGRAMUNIFORM3DPROC)(*in_RDI)(in_RSI,"glProgramUniform3d");
    sf_glad_glProgramUniform3dv =
         (PFNGLPROGRAMUNIFORM3DVPROC)(*in_RDI)(in_RSI,"glProgramUniform3dv");
    sf_glad_glProgramUniform3f = (PFNGLPROGRAMUNIFORM3FPROC)(*in_RDI)(in_RSI,"glProgramUniform3f");
    sf_glad_glProgramUniform3fv =
         (PFNGLPROGRAMUNIFORM3FVPROC)(*in_RDI)(in_RSI,"glProgramUniform3fv");
    sf_glad_glProgramUniform3i = (PFNGLPROGRAMUNIFORM3IPROC)(*in_RDI)(in_RSI,"glProgramUniform3i");
    sf_glad_glProgramUniform3iv =
         (PFNGLPROGRAMUNIFORM3IVPROC)(*in_RDI)(in_RSI,"glProgramUniform3iv");
    sf_glad_glProgramUniform3ui =
         (PFNGLPROGRAMUNIFORM3UIPROC)(*in_RDI)(in_RSI,"glProgramUniform3ui");
    sf_glad_glProgramUniform3uiv =
         (PFNGLPROGRAMUNIFORM3UIVPROC)(*in_RDI)(in_RSI,"glProgramUniform3uiv");
    sf_glad_glProgramUniform4d = (PFNGLPROGRAMUNIFORM4DPROC)(*in_RDI)(in_RSI,"glProgramUniform4d");
    sf_glad_glProgramUniform4dv =
         (PFNGLPROGRAMUNIFORM4DVPROC)(*in_RDI)(in_RSI,"glProgramUniform4dv");
    sf_glad_glProgramUniform4f = (PFNGLPROGRAMUNIFORM4FPROC)(*in_RDI)(in_RSI,"glProgramUniform4f");
    sf_glad_glProgramUniform4fv =
         (PFNGLPROGRAMUNIFORM4FVPROC)(*in_RDI)(in_RSI,"glProgramUniform4fv");
    sf_glad_glProgramUniform4i = (PFNGLPROGRAMUNIFORM4IPROC)(*in_RDI)(in_RSI,"glProgramUniform4i");
    sf_glad_glProgramUniform4iv =
         (PFNGLPROGRAMUNIFORM4IVPROC)(*in_RDI)(in_RSI,"glProgramUniform4iv");
    sf_glad_glProgramUniform4ui =
         (PFNGLPROGRAMUNIFORM4UIPROC)(*in_RDI)(in_RSI,"glProgramUniform4ui");
    sf_glad_glProgramUniform4uiv =
         (PFNGLPROGRAMUNIFORM4UIVPROC)(*in_RDI)(in_RSI,"glProgramUniform4uiv");
    sf_glad_glProgramUniformMatrix2dv =
         (PFNGLPROGRAMUNIFORMMATRIX2DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix2dv");
    sf_glad_glProgramUniformMatrix2fv =
         (PFNGLPROGRAMUNIFORMMATRIX2FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix2fv");
    sf_glad_glProgramUniformMatrix2x3dv =
         (PFNGLPROGRAMUNIFORMMATRIX2X3DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix2x3dv");
    sf_glad_glProgramUniformMatrix2x3fv =
         (PFNGLPROGRAMUNIFORMMATRIX2X3FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix2x3fv");
    sf_glad_glProgramUniformMatrix2x4dv =
         (PFNGLPROGRAMUNIFORMMATRIX2X4DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix2x4dv");
    sf_glad_glProgramUniformMatrix2x4fv =
         (PFNGLPROGRAMUNIFORMMATRIX2X4FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix2x4fv");
    sf_glad_glProgramUniformMatrix3dv =
         (PFNGLPROGRAMUNIFORMMATRIX3DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix3dv");
    sf_glad_glProgramUniformMatrix3fv =
         (PFNGLPROGRAMUNIFORMMATRIX3FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix3fv");
    sf_glad_glProgramUniformMatrix3x2dv =
         (PFNGLPROGRAMUNIFORMMATRIX3X2DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix3x2dv");
    sf_glad_glProgramUniformMatrix3x2fv =
         (PFNGLPROGRAMUNIFORMMATRIX3X2FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix3x2fv");
    sf_glad_glProgramUniformMatrix3x4dv =
         (PFNGLPROGRAMUNIFORMMATRIX3X4DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix3x4dv");
    sf_glad_glProgramUniformMatrix3x4fv =
         (PFNGLPROGRAMUNIFORMMATRIX3X4FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix3x4fv");
    sf_glad_glProgramUniformMatrix4dv =
         (PFNGLPROGRAMUNIFORMMATRIX4DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix4dv");
    sf_glad_glProgramUniformMatrix4fv =
         (PFNGLPROGRAMUNIFORMMATRIX4FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix4fv");
    sf_glad_glProgramUniformMatrix4x2dv =
         (PFNGLPROGRAMUNIFORMMATRIX4X2DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix4x2dv");
    sf_glad_glProgramUniformMatrix4x2fv =
         (PFNGLPROGRAMUNIFORMMATRIX4X2FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix4x2fv");
    sf_glad_glProgramUniformMatrix4x3dv =
         (PFNGLPROGRAMUNIFORMMATRIX4X3DVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix4x3dv");
    sf_glad_glProgramUniformMatrix4x3fv =
         (PFNGLPROGRAMUNIFORMMATRIX4X3FVPROC)(*in_RDI)(in_RSI,"glProgramUniformMatrix4x3fv");
    sf_glad_glUseProgramStages = (PFNGLUSEPROGRAMSTAGESPROC)(*in_RDI)(in_RSI,"glUseProgramStages");
    sf_glad_glValidateProgramPipeline =
         (PFNGLVALIDATEPROGRAMPIPELINEPROC)(*in_RDI)(in_RSI,"glValidateProgramPipeline");
  }
  return;
}

Assistant:

static void sf_glad_gl_load_GL_ARB_separate_shader_objects( GLADuserptrloadfunc load, void* userptr) {
    if(!SF_GLAD_GL_ARB_separate_shader_objects) return;
    sf_glad_glActiveShaderProgram = (PFNGLACTIVESHADERPROGRAMPROC) load(userptr, "glActiveShaderProgram");
    sf_glad_glBindProgramPipeline = (PFNGLBINDPROGRAMPIPELINEPROC) load(userptr, "glBindProgramPipeline");
    sf_glad_glCreateShaderProgramv = (PFNGLCREATESHADERPROGRAMVPROC) load(userptr, "glCreateShaderProgramv");
    sf_glad_glDeleteProgramPipelines = (PFNGLDELETEPROGRAMPIPELINESPROC) load(userptr, "glDeleteProgramPipelines");
    sf_glad_glGenProgramPipelines = (PFNGLGENPROGRAMPIPELINESPROC) load(userptr, "glGenProgramPipelines");
    sf_glad_glGetProgramPipelineInfoLog = (PFNGLGETPROGRAMPIPELINEINFOLOGPROC) load(userptr, "glGetProgramPipelineInfoLog");
    sf_glad_glGetProgramPipelineiv = (PFNGLGETPROGRAMPIPELINEIVPROC) load(userptr, "glGetProgramPipelineiv");
    sf_glad_glIsProgramPipeline = (PFNGLISPROGRAMPIPELINEPROC) load(userptr, "glIsProgramPipeline");
    sf_glad_glProgramParameteri = (PFNGLPROGRAMPARAMETERIPROC) load(userptr, "glProgramParameteri");
    sf_glad_glProgramUniform1d = (PFNGLPROGRAMUNIFORM1DPROC) load(userptr, "glProgramUniform1d");
    sf_glad_glProgramUniform1dv = (PFNGLPROGRAMUNIFORM1DVPROC) load(userptr, "glProgramUniform1dv");
    sf_glad_glProgramUniform1f = (PFNGLPROGRAMUNIFORM1FPROC) load(userptr, "glProgramUniform1f");
    sf_glad_glProgramUniform1fv = (PFNGLPROGRAMUNIFORM1FVPROC) load(userptr, "glProgramUniform1fv");
    sf_glad_glProgramUniform1i = (PFNGLPROGRAMUNIFORM1IPROC) load(userptr, "glProgramUniform1i");
    sf_glad_glProgramUniform1iv = (PFNGLPROGRAMUNIFORM1IVPROC) load(userptr, "glProgramUniform1iv");
    sf_glad_glProgramUniform1ui = (PFNGLPROGRAMUNIFORM1UIPROC) load(userptr, "glProgramUniform1ui");
    sf_glad_glProgramUniform1uiv = (PFNGLPROGRAMUNIFORM1UIVPROC) load(userptr, "glProgramUniform1uiv");
    sf_glad_glProgramUniform2d = (PFNGLPROGRAMUNIFORM2DPROC) load(userptr, "glProgramUniform2d");
    sf_glad_glProgramUniform2dv = (PFNGLPROGRAMUNIFORM2DVPROC) load(userptr, "glProgramUniform2dv");
    sf_glad_glProgramUniform2f = (PFNGLPROGRAMUNIFORM2FPROC) load(userptr, "glProgramUniform2f");
    sf_glad_glProgramUniform2fv = (PFNGLPROGRAMUNIFORM2FVPROC) load(userptr, "glProgramUniform2fv");
    sf_glad_glProgramUniform2i = (PFNGLPROGRAMUNIFORM2IPROC) load(userptr, "glProgramUniform2i");
    sf_glad_glProgramUniform2iv = (PFNGLPROGRAMUNIFORM2IVPROC) load(userptr, "glProgramUniform2iv");
    sf_glad_glProgramUniform2ui = (PFNGLPROGRAMUNIFORM2UIPROC) load(userptr, "glProgramUniform2ui");
    sf_glad_glProgramUniform2uiv = (PFNGLPROGRAMUNIFORM2UIVPROC) load(userptr, "glProgramUniform2uiv");
    sf_glad_glProgramUniform3d = (PFNGLPROGRAMUNIFORM3DPROC) load(userptr, "glProgramUniform3d");
    sf_glad_glProgramUniform3dv = (PFNGLPROGRAMUNIFORM3DVPROC) load(userptr, "glProgramUniform3dv");
    sf_glad_glProgramUniform3f = (PFNGLPROGRAMUNIFORM3FPROC) load(userptr, "glProgramUniform3f");
    sf_glad_glProgramUniform3fv = (PFNGLPROGRAMUNIFORM3FVPROC) load(userptr, "glProgramUniform3fv");
    sf_glad_glProgramUniform3i = (PFNGLPROGRAMUNIFORM3IPROC) load(userptr, "glProgramUniform3i");
    sf_glad_glProgramUniform3iv = (PFNGLPROGRAMUNIFORM3IVPROC) load(userptr, "glProgramUniform3iv");
    sf_glad_glProgramUniform3ui = (PFNGLPROGRAMUNIFORM3UIPROC) load(userptr, "glProgramUniform3ui");
    sf_glad_glProgramUniform3uiv = (PFNGLPROGRAMUNIFORM3UIVPROC) load(userptr, "glProgramUniform3uiv");
    sf_glad_glProgramUniform4d = (PFNGLPROGRAMUNIFORM4DPROC) load(userptr, "glProgramUniform4d");
    sf_glad_glProgramUniform4dv = (PFNGLPROGRAMUNIFORM4DVPROC) load(userptr, "glProgramUniform4dv");
    sf_glad_glProgramUniform4f = (PFNGLPROGRAMUNIFORM4FPROC) load(userptr, "glProgramUniform4f");
    sf_glad_glProgramUniform4fv = (PFNGLPROGRAMUNIFORM4FVPROC) load(userptr, "glProgramUniform4fv");
    sf_glad_glProgramUniform4i = (PFNGLPROGRAMUNIFORM4IPROC) load(userptr, "glProgramUniform4i");
    sf_glad_glProgramUniform4iv = (PFNGLPROGRAMUNIFORM4IVPROC) load(userptr, "glProgramUniform4iv");
    sf_glad_glProgramUniform4ui = (PFNGLPROGRAMUNIFORM4UIPROC) load(userptr, "glProgramUniform4ui");
    sf_glad_glProgramUniform4uiv = (PFNGLPROGRAMUNIFORM4UIVPROC) load(userptr, "glProgramUniform4uiv");
    sf_glad_glProgramUniformMatrix2dv = (PFNGLPROGRAMUNIFORMMATRIX2DVPROC) load(userptr, "glProgramUniformMatrix2dv");
    sf_glad_glProgramUniformMatrix2fv = (PFNGLPROGRAMUNIFORMMATRIX2FVPROC) load(userptr, "glProgramUniformMatrix2fv");
    sf_glad_glProgramUniformMatrix2x3dv = (PFNGLPROGRAMUNIFORMMATRIX2X3DVPROC) load(userptr, "glProgramUniformMatrix2x3dv");
    sf_glad_glProgramUniformMatrix2x3fv = (PFNGLPROGRAMUNIFORMMATRIX2X3FVPROC) load(userptr, "glProgramUniformMatrix2x3fv");
    sf_glad_glProgramUniformMatrix2x4dv = (PFNGLPROGRAMUNIFORMMATRIX2X4DVPROC) load(userptr, "glProgramUniformMatrix2x4dv");
    sf_glad_glProgramUniformMatrix2x4fv = (PFNGLPROGRAMUNIFORMMATRIX2X4FVPROC) load(userptr, "glProgramUniformMatrix2x4fv");
    sf_glad_glProgramUniformMatrix3dv = (PFNGLPROGRAMUNIFORMMATRIX3DVPROC) load(userptr, "glProgramUniformMatrix3dv");
    sf_glad_glProgramUniformMatrix3fv = (PFNGLPROGRAMUNIFORMMATRIX3FVPROC) load(userptr, "glProgramUniformMatrix3fv");
    sf_glad_glProgramUniformMatrix3x2dv = (PFNGLPROGRAMUNIFORMMATRIX3X2DVPROC) load(userptr, "glProgramUniformMatrix3x2dv");
    sf_glad_glProgramUniformMatrix3x2fv = (PFNGLPROGRAMUNIFORMMATRIX3X2FVPROC) load(userptr, "glProgramUniformMatrix3x2fv");
    sf_glad_glProgramUniformMatrix3x4dv = (PFNGLPROGRAMUNIFORMMATRIX3X4DVPROC) load(userptr, "glProgramUniformMatrix3x4dv");
    sf_glad_glProgramUniformMatrix3x4fv = (PFNGLPROGRAMUNIFORMMATRIX3X4FVPROC) load(userptr, "glProgramUniformMatrix3x4fv");
    sf_glad_glProgramUniformMatrix4dv = (PFNGLPROGRAMUNIFORMMATRIX4DVPROC) load(userptr, "glProgramUniformMatrix4dv");
    sf_glad_glProgramUniformMatrix4fv = (PFNGLPROGRAMUNIFORMMATRIX4FVPROC) load(userptr, "glProgramUniformMatrix4fv");
    sf_glad_glProgramUniformMatrix4x2dv = (PFNGLPROGRAMUNIFORMMATRIX4X2DVPROC) load(userptr, "glProgramUniformMatrix4x2dv");
    sf_glad_glProgramUniformMatrix4x2fv = (PFNGLPROGRAMUNIFORMMATRIX4X2FVPROC) load(userptr, "glProgramUniformMatrix4x2fv");
    sf_glad_glProgramUniformMatrix4x3dv = (PFNGLPROGRAMUNIFORMMATRIX4X3DVPROC) load(userptr, "glProgramUniformMatrix4x3dv");
    sf_glad_glProgramUniformMatrix4x3fv = (PFNGLPROGRAMUNIFORMMATRIX4X3FVPROC) load(userptr, "glProgramUniformMatrix4x3fv");
    sf_glad_glUseProgramStages = (PFNGLUSEPROGRAMSTAGESPROC) load(userptr, "glUseProgramStages");
    sf_glad_glValidateProgramPipeline = (PFNGLVALIDATEPROGRAMPIPELINEPROC) load(userptr, "glValidateProgramPipeline");
}